

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

ssize_t iso9660_write_data(archive_write *a,void *buff,size_t s)

{
  long lVar1;
  mode_t mVar2;
  ulong in_RDX;
  size_t in_RSI;
  void *in_RDI;
  ssize_t r;
  iso9660_conflict *iso9660;
  undefined8 local_20;
  archive_write *in_stack_fffffffffffffff8;
  ssize_t sVar3;
  
  lVar1 = *(long *)((long)in_RDI + 0xd0);
  if (*(long *)(lVar1 + 0x10) == 0) {
    sVar3 = 0;
  }
  else {
    mVar2 = archive_entry_filetype(*(archive_entry **)(*(long *)(lVar1 + 0x10) + 0x20));
    if (mVar2 == 0x8000) {
      local_20 = in_RDX;
      if (*(ulong *)(lVar1 + 0x38) < in_RDX) {
        local_20 = *(ulong *)(lVar1 + 0x38);
      }
      if (local_20 == 0) {
        sVar3 = 0;
      }
      else {
        sVar3 = write_iso9660_data(in_stack_fffffffffffffff8,in_RDI,in_RSI);
        if (0 < sVar3) {
          *(long *)(lVar1 + 0x38) = *(long *)(lVar1 + 0x38) - sVar3;
        }
      }
    }
    else {
      sVar3 = 0;
    }
  }
  return sVar3;
}

Assistant:

static ssize_t
iso9660_write_data(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	ssize_t r;

	if (iso9660->cur_file == NULL)
		return (0);
	if (archive_entry_filetype(iso9660->cur_file->entry) != AE_IFREG)
		return (0);
	if (s > iso9660->bytes_remaining)
		s = (size_t)iso9660->bytes_remaining;
	if (s == 0)
		return (0);

	r = write_iso9660_data(a, buff, s);
	if (r > 0)
		iso9660->bytes_remaining -= r;
	return (r);
}